

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathedit.cpp
# Opt level: O1

QStringList * __thiscall
QPathEdit::modelFilters
          (QStringList *__return_storage_ptr__,QPathEdit *this,QStringList *normalFilters)

{
  char cVar1;
  int iVar2;
  iterator b;
  iterator e;
  QForeachContainer<QList<QString>_> _container_370;
  QString filter;
  QRegularExpressionMatch match;
  QArrayDataPointer<QString> local_b0;
  QString *local_98;
  QString *local_90;
  undefined4 local_88;
  QArrayData *local_80;
  char16_t *local_78;
  qsizetype local_70;
  QRegularExpressionMatch local_68 [8];
  QArrayData *local_60 [3];
  QArrayDataPointer<QString> local_48;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (modelFilters(QList<QString>const&)::re == '\0') {
    iVar2 = __cxa_guard_acquire(&modelFilters(QList<QString>const&)::re);
    if (iVar2 != 0) {
      QString::QString((QString *)&local_b0,"^.*\\((.*)\\)$");
      QRegularExpression::QRegularExpression
                ((QRegularExpression *)&modelFilters(QList<QString>const&)::re,&local_b0,0);
      if (&(local_b0.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b0.d)->super_QArrayData,2,8);
        }
      }
      __cxa_atexit(QRegularExpression::~QRegularExpression,&modelFilters(QList<QString>const&)::re,
                   &__dso_handle);
      __cxa_guard_release(&modelFilters(QList<QString>const&)::re);
    }
  }
  if (modelFilters(QList<QString>const&)::re2 == '\0') {
    iVar2 = __cxa_guard_acquire(&modelFilters(QList<QString>const&)::re2);
    if (iVar2 != 0) {
      QString::QString((QString *)&local_b0,"\\s");
      QRegularExpression::QRegularExpression
                ((QRegularExpression *)&modelFilters(QList<QString>const&)::re2,&local_b0,0);
      if (&(local_b0.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b0.d)->super_QArrayData,2,8);
        }
      }
      __cxa_atexit(QRegularExpression::~QRegularExpression,&modelFilters(QList<QString>const&)::re2,
                   &__dso_handle);
      __cxa_guard_release(&modelFilters(QList<QString>const&)::re2);
    }
  }
  local_b0.d = (normalFilters->d).d;
  local_98 = (normalFilters->d).ptr;
  local_b0.size = (normalFilters->d).size;
  if (local_b0.d != (Data *)0x0) {
    LOCK();
    ((local_b0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_90 = local_98 + local_b0.size;
  local_88 = 1;
  local_b0.ptr = local_98;
  if (local_b0.size * 0x18 != 0) {
    do {
      local_80 = &((local_98->d).d)->super_QArrayData;
      local_78 = (local_98->d).ptr;
      local_70 = (local_98->d).size;
      if (local_80 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&local_80->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&local_80->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QRegularExpression::match(local_68,&modelFilters(QList<QString>const&)::re,&local_80,0,0,0);
      cVar1 = QRegularExpressionMatch::hasMatch();
      if (cVar1 != '\0') {
        QRegularExpressionMatch::captured((int)local_60);
        QString::split(&local_48,local_60,&modelFilters(QList<QString>const&)::re2);
        if (local_48.size != 0) {
          if ((local_48.d == (Data *)0x0) ||
             (1 < ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QtPrivate::QCommonArrayOps<QString>::growAppend
                      ((QCommonArrayOps<QString> *)__return_storage_ptr__,local_48.ptr,
                       local_48.ptr + local_48.size);
          }
          else {
            QArrayDataPointer<QString>::detachAndGrow
                      (&__return_storage_ptr__->d,GrowsAtEnd,local_48.size,(QString **)0x0,
                       (QArrayDataPointer<QString> *)0x0);
            b = QList<QString>::begin((QList<QString> *)&local_48);
            e = QList<QString>::end((QList<QString> *)&local_48);
            QtPrivate::QGenericArrayOps<QString>::moveAppend
                      ((QGenericArrayOps<QString> *)__return_storage_ptr__,b.i,e.i);
          }
        }
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
        if (local_60[0] != (QArrayData *)0x0) {
          LOCK();
          (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_60[0],2,8);
          }
        }
      }
      QRegularExpressionMatch::~QRegularExpressionMatch(local_68);
      if (local_80 != (QArrayData *)0x0) {
        LOCK();
        (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_80,2,8);
        }
      }
      local_98 = local_98 + 1;
    } while (local_98 != local_90);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

QStringList QPathEdit::modelFilters(const QStringList &normalFilters) {
	QStringList res;
    static QRegularExpression re = QRegularExpression("^.*\\((.*)\\)$");
    static QRegularExpression re2 = QRegularExpression("\\s");
    foreach(QString filter, normalFilters) {
        QRegularExpressionMatch match = re.match(filter);
        if(match.hasMatch()) {
            res.append(match.captured(1).split(re2));
        }
	}
	return res;
}